

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

WORD32 dispq_producer_dequeue(vid_dec_ctx_t *ps_app_ctx)

{
  int iVar1;
  uint uVar2;
  
  while( true ) {
    iVar1 = ps_app_ctx->disp_q_wr_idx;
    uVar2 = iVar1 + 4;
    if (-1 < (int)(iVar1 + 1U)) {
      uVar2 = iVar1 + 1U;
    }
    if ((iVar1 - (uVar2 & 0xfffffffc)) + 1 != ps_app_ctx->disp_q_rd_idx) break;
    ithread_msleep(1);
    if (ps_app_ctx->quit != 0) {
      return -1;
    }
  }
  return iVar1;
}

Assistant:

WORD32 dispq_producer_dequeue(vid_dec_ctx_t *ps_app_ctx)
{
    WORD32 idx;

    /* If there is no free buffer wait */

    while(((ps_app_ctx->disp_q_wr_idx + 1) % NUM_DISPLAY_BUFFERS) == ps_app_ctx->disp_q_rd_idx)
    {

        ithread_msleep(1);

        if(ps_app_ctx->quit)
            return (-1);
    }

    idx = ps_app_ctx->disp_q_wr_idx;
    return (idx);
}